

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7.c
# Opt level: O1

int i2d_PKCS7_ISSUER_AND_SUBJECT_bio(BIO *bio,PKCS7_ISSUER_AND_SUBJECT *ias)

{
  int len;
  int iVar1;
  uchar *pout;
  uchar *local_28;
  
  local_28 = (uchar *)0x0;
  iVar1 = 0;
  if (ias != (PKCS7_ISSUER_AND_SUBJECT *)0x0 && bio != (BIO *)0x0) {
    len = i2d_PKCS7_ISSUER_AND_SUBJECT(ias,&local_28);
    iVar1 = 0;
    if (local_28 != (uchar *)0x0 && 0 < len) {
      BIO_write((BIO *)bio,local_28,len);
      CRYPTO_free(local_28);
      iVar1 = len;
    }
  }
  return iVar1;
}

Assistant:

int i2d_PKCS7_ISSUER_AND_SUBJECT_bio(BIO *bio, PKCS7_ISSUER_AND_SUBJECT *ias) {
	unsigned char * pout = NULL;
	int len = 0;

	if (!bio || !ias)
		return 0;

	len = i2d_PKCS7_ISSUER_AND_SUBJECT(ias, &pout);

	if (len <= 0 || !pout)
		return 0;

	BIO_write(bio, pout, len);
	OPENSSL_free(pout);

	return len;
}